

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerMSL::to_buffer_size_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,uint32_t id)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  reference pcVar4;
  CompilerError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  long local_f0;
  size_type last_pos;
  SPIRVariable *var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> array_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer_expr;
  char *c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  long local_48;
  size_type index;
  string expr;
  uint32_t id_local;
  CompilerMSL *this_local;
  
  expr.field_2._12_4_ = id;
  CompilerGLSL::to_expression_abi_cxx11_((string *)&index,&this->super_CompilerGLSL,id,true);
  local_48 = ::std::__cxx11::string::find_first_of((char)&index,0x5b);
  uVar2 = ::std::__cxx11::string::size();
  if (((2 < uVar2) &&
      (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)&index), *pcVar3 == '(')) &&
     (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)&index), *pcVar3 == '*')) {
    CompilerGLSL::address_of_expression
              ((string *)&__range1,&this->super_CompilerGLSL,(string *)&index);
    ::std::__cxx11::string::operator=((string *)&index,(string *)&__range1);
    ::std::__cxx11::string::~string((string *)&__range1);
  }
  __end1._M_current = (char *)::std::__cxx11::string::begin();
  c = (char *)::std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&c), bVar1) {
    pcVar4 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    if (*pcVar4 == '.') {
      *pcVar4 = '_';
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  if (local_48 == -1) {
    ::std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                     &this->buffer_size_name_suffix);
    goto LAB_0036e9fb;
  }
  ::std::__cxx11::string::substr((ulong)((long)&array_expr.field_2 + 8),(ulong)&index);
  ::std::__cxx11::string::substr((ulong)&var,(ulong)&index);
  last_pos = (size_type)Compiler::maybe_get_backing_variable((Compiler *)this,expr.field_2._12_4_);
  if (((SPIRVariable *)last_pos == (SPIRVariable *)0x0) ||
     (bVar1 = is_var_runtime_size_array(this,(SPIRVariable *)last_pos), !bVar1)) {
LAB_0036e956:
    ::std::operator+(&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&array_expr.field_2 + 8),&this->buffer_size_name_suffix);
    ::std::operator+(__return_storage_ptr__,&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var);
    ::std::__cxx11::string::~string((string *)&local_170);
  }
  else {
    if (((this->msl_options).runtime_array_rich_descriptor & 1U) == 0) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"OpArrayLength requires rich descriptor format");
      __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    local_f0 = ::std::__cxx11::string::find_last_of((char)&var,0x5d);
    if (local_f0 == -1) goto LAB_0036e956;
    ::std::operator+(&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&array_expr.field_2 + 8),".length(");
    ::std::__cxx11::string::substr((ulong)&local_150,(ulong)&var);
    ::std::operator+(&local_110,&local_130,&local_150);
    ::std::operator+(__return_storage_ptr__,&local_110,")");
    ::std::__cxx11::string::~string((string *)&local_110);
    ::std::__cxx11::string::~string((string *)&local_150);
    ::std::__cxx11::string::~string((string *)&local_130);
  }
  ::std::__cxx11::string::~string((string *)&var);
  ::std::__cxx11::string::~string((string *)(array_expr.field_2._M_local_buf + 8));
LAB_0036e9fb:
  ::std::__cxx11::string::~string((string *)&index);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_buffer_size_expression(uint32_t id)
{
	auto expr = to_expression(id);
	auto index = expr.find_first_of('[');

	// This is quite crude, but we need to translate the reference name (*spvDescriptorSetN.name) to
	// the pointer expression spvDescriptorSetN.name to make a reasonable expression here.
	// This only happens if we have argument buffers and we are using OpArrayLength on a lone SSBO in that set.
	if (expr.size() >= 3 && expr[0] == '(' && expr[1] == '*')
		expr = address_of_expression(expr);

	// If a buffer is part of an argument buffer translate this to a legal identifier.
	for (auto &c : expr)
		if (c == '.')
			c = '_';

	if (index == string::npos)
		return expr + buffer_size_name_suffix;
	else
	{
		auto buffer_expr = expr.substr(0, index);
		auto array_expr = expr.substr(index);
		if (auto var = maybe_get_backing_variable(id))
		{
			if (is_var_runtime_size_array(*var))
			{
				if (!msl_options.runtime_array_rich_descriptor)
					SPIRV_CROSS_THROW("OpArrayLength requires rich descriptor format");

				auto last_pos = array_expr.find_last_of(']');
				if (last_pos != std::string::npos)
					return buffer_expr + ".length(" + array_expr.substr(1, last_pos - 1) + ")";
			}
		}
		return buffer_expr + buffer_size_name_suffix + array_expr;
	}
}